

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall
Qentem::Array<Qentem::Value<char>_>::resize(Array<Qentem::Value<char>_> *this,SizeT new_size)

{
  SizeT SVar1;
  Value<char> *from;
  Value<char> *to;
  Value<char> *des;
  Value<char> *src;
  SizeT32 type_size;
  SizeT new_size_local;
  Array<Qentem::Value<char>_> *this_local;
  
  from = Storage(this);
  setCapacity(this,new_size);
  to = allocate(this);
  SVar1 = Size(this);
  Memory::Copy<unsigned_int>(to,from,SVar1 * 0x18);
  Memory::Deallocate(from);
  return;
}

Assistant:

void resize(SizeT new_size) {
        constexpr SizeT32 type_size = sizeof(Type_T);
        Type_T           *src       = Storage();

        setCapacity(new_size);

        Type_T *des = allocate();
        Memory::Copy(des, src, (Size() * type_size));
        Memory::Deallocate(src);
    }